

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

char * Prs_CreateDetectRamPort(Prs_Ntk_t *pNtk,Vec_Int_t *vBox,int NameRamId)

{
  Abc_Nam_t *p;
  int iVar1;
  int Lit;
  char *pcVar2;
  int ActId;
  int FormId;
  int i;
  int NameRamId_local;
  Vec_Int_t *vBox_local;
  Prs_Ntk_t *pNtk_local;
  
  ActId = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vBox);
    if (iVar1 <= ActId + 1) {
      return (char *)0x0;
    }
    iVar1 = Vec_IntEntry(vBox,ActId);
    Lit = Vec_IntEntry(vBox,ActId + 1);
    if (iVar1 == NameRamId) break;
    ActId = ActId + 2;
  }
  p = pNtk->pStrs;
  iVar1 = Abc_Lit2Var2(Lit);
  pcVar2 = Abc_NamStr(p,iVar1);
  return pcVar2;
}

Assistant:

char * Prs_CreateDetectRamPort( Prs_Ntk_t * pNtk, Vec_Int_t * vBox, int NameRamId )
{
    int i, FormId, ActId;
    Vec_IntForEachEntryDouble( vBox, FormId, ActId, i )
        if ( FormId == NameRamId )
            return Abc_NamStr(pNtk->pStrs, Abc_Lit2Var2(ActId));
    return NULL;
}